

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O2

ostream * std::operator<<(ostream *os,
                         vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                         *v)

{
  pointer ptVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  
  std::operator<<(os,"[");
  lVar2 = 0;
  for (uVar3 = 0;
      ptVar1 = (v->
               super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(v->
                            super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ptVar1 >> 2);
      uVar3 = uVar3 + 1) {
    operator<<(os,(texcoord2h *)((long)&(ptVar1->s).value + lVar2));
    if (uVar3 != ((long)(v->
                        super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(v->
                        super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 2) - 1U) {
      std::operator<<(os,", ");
    }
    lVar2 = lVar2 + 4;
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}